

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall HModel::util_chgColBoundsAll(HModel *this,double *XcolLower,double *XcolUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  pdVar1 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar5 = (ulong)(uint)this->numCol;
  if (this->numCol < 1) {
    uVar5 = uVar4;
  }
  while( true ) {
    if (uVar5 == uVar4) {
      mlFg_Update(this,this->mlFg_action_NewBounds);
      return 0;
    }
    dVar7 = XcolLower[uVar4];
    if (1e+200 <= dVar7) break;
    dVar6 = XcolUpper[uVar4];
    if (dVar6 <= -1e+200) {
      return ~(uint)uVar4;
    }
    if (-1e+200 < dVar7) {
      dVar7 = dVar7 / pdVar1[uVar4];
    }
    pdVar2[uVar4] = dVar7;
    if (dVar6 < 1e+200) {
      dVar6 = dVar6 / pdVar1[uVar4];
    }
    pdVar3[uVar4] = dVar6;
    uVar4 = uVar4 + 1;
  }
  return (uint)uVar4 + 1;
}

Assistant:

int HModel::util_chgColBoundsAll(const double* XcolLower, const double* XcolUpper) {
  assert(XcolLower != NULL);
  assert(XcolUpper != NULL);
  for (int col = 0; col < numCol; ++col) {
    double lower = XcolLower[col];
    double upper = XcolUpper[col];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return col+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(col+1);
    assert(lower<=upper);
    colLower[col] = (hsol_isInfinity(-lower) ? lower : lower / colScale[col]);
    colUpper[col] = (hsol_isInfinity( upper) ? upper : upper / colScale[col]);
    //    printf("[LB; Pr; UB] for column %2d are now [%11g, %11g, %11g] Dual = %g\n", col, colLower[col], workValue[col], colUpper[col], workDual[col]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;
}